

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

int mg_map_equal(mg_map *lhs,mg_map *rhs)

{
  ulong uVar1;
  uint uVar2;
  mg_string **ppmVar3;
  mg_string **ppmVar4;
  int iVar5;
  uint uVar6;
  mg_string *pmVar7;
  mg_string *pmVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar2 = lhs->size;
  uVar6 = 0;
  if (uVar2 == rhs->size) {
    bVar10 = uVar2 == 0;
    if (!bVar10) {
      ppmVar3 = lhs->keys;
      ppmVar4 = rhs->keys;
      pmVar7 = *ppmVar3;
      pmVar8 = *ppmVar4;
      uVar6 = pmVar7->size;
      if (uVar6 == pmVar8->size) {
        uVar9 = 0;
        do {
          iVar5 = bcmp(pmVar7->data,pmVar8->data,(ulong)uVar6);
          if (iVar5 != 0) break;
          iVar5 = mg_value_equal(lhs->values[uVar9],rhs->values[uVar9]);
          if (iVar5 == 0) break;
          uVar1 = uVar9 + 1;
          bVar10 = uVar2 <= (uint)uVar1;
          if (uVar2 - 1 == (int)uVar9) break;
          pmVar7 = ppmVar3[uVar1 & 0xffffffff];
          pmVar8 = ppmVar4[uVar1 & 0xffffffff];
          uVar6 = pmVar7->size;
          uVar9 = uVar1;
        } while (uVar6 == pmVar8->size);
      }
    }
    uVar6 = (uint)bVar10;
  }
  return uVar6;
}

Assistant:

int mg_map_equal(const mg_map *lhs, const mg_map *rhs) {
  if (lhs->size != rhs->size) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->size; ++i) {
    if (!mg_string_equal(lhs->keys[i], rhs->keys[i])) return 0;
    if (!mg_value_equal(lhs->values[i], rhs->values[i])) return 0;
  }
  return 1;
}